

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O2

void emit_loadu64(ASMState *as,Reg r,uint64_t u64)

{
  MCode *p;
  MCode *pMVar1;
  byte bVar2;
  int i;
  
  i = (int)u64;
  if (u64 >> 0x20 == 0) {
    emit_loadi(as,r,i);
    return;
  }
  bVar2 = (byte)r;
  pMVar1 = as->mcp;
  if ((long)i == u64) {
    *(int *)(pMVar1 + -4) = i;
    pMVar1[-5] = bVar2 & 7 | 0xc0;
    pMVar1[-6] = 199;
    pMVar1[-7] = bVar2 >> 3 & 1 | 0x48;
    pMVar1 = pMVar1 + -7;
  }
  else {
    *(uint64_t *)(pMVar1 + -8) = u64;
    pMVar1[-9] = bVar2 & 7 | 0xb8;
    pMVar1[-10] = bVar2 >> 3 & 1 | 0x48;
    pMVar1 = pMVar1 + -10;
  }
  as->mcp = pMVar1;
  return;
}

Assistant:

static void emit_loadu64(ASMState *as, Reg r, uint64_t u64)
{
  if (checku32(u64)) {  /* 32 bit load clears upper 32 bits. */
    emit_loadi(as, r, (int32_t)u64);
  } else if (checki32((int64_t)u64)) {  /* Sign-extended 32 bit load. */
    MCode *p = as->mcp;
    *(int32_t *)(p-4) = (int32_t)u64;
    as->mcp = emit_opm(XO_MOVmi, XM_REG, REX_64, r, p, -4);
  } else {  /* Full-size 64 bit load. */
    MCode *p = as->mcp;
    *(uint64_t *)(p-8) = u64;
    p[-9] = (MCode)(XI_MOVri+(r&7));
    p[-10] = 0x48 + ((r>>3)&1);
    p -= 10;
    as->mcp = p;
  }
}